

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::string,char[19]>
          (detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
          char *op,char (*rhs) [19])

{
  String local_58 [3];
  String local_40;
  String local_38;
  String local_30;
  char (*local_28) [19];
  char (*rhs_local) [19];
  char *op_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs_local;
  
  local_28 = rhs;
  rhs_local = (char (*) [19])op;
  op_local = (char *)lhs;
  lhs_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  toString<std::__cxx11::string>((doctest *)&local_38,lhs);
  String::String(&local_40,*rhs_local);
  String::operator+(&local_30,&local_38);
  toString<char[19]>((doctest *)local_58,local_28);
  String::operator+((String *)this,&local_30);
  String::~String(local_58);
  String::~String(&local_30);
  String::~String(&local_40);
  String::~String(&local_38);
  return (String)(char *)this;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return toString(lhs) + op + toString(rhs);
    }